

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_1::ThreadGroup::run(TestStatus *__return_storage_ptr__,ThreadGroup *this)

{
  bool bVar1;
  qpTestResult qVar2;
  size_type sVar3;
  reference pSVar4;
  ThreadGroupThread *pTVar5;
  string local_e0;
  string local_c0;
  ResultCollector *local_a0;
  ResultCollector *threadResult;
  __normal_iterator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_*,_std::vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>_>
  local_90;
  iterator threadIter_1;
  __normal_iterator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_*,_std::vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>_>
  local_80;
  iterator threadIter;
  undefined1 local_68 [8];
  ResultCollector resultCollector;
  ThreadGroup *this_local;
  
  resultCollector.m_message.field_2._8_8_ = this;
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_68);
  sVar3 = std::
          vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
          ::size(&this->m_threads);
  de::SpinBarrier::reset(&this->m_barrier,(deUint32)sVar3);
  local_80._M_current =
       (SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread> *)
       std::
       vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
       ::begin(&this->m_threads);
  while( true ) {
    threadIter_1 = std::
                   vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                   ::end(&this->m_threads);
    bVar1 = __gnu_cxx::operator!=(&local_80,&threadIter_1);
    if (!bVar1) break;
    pSVar4 = __gnu_cxx::
             __normal_iterator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_*,_std::vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>_>
             ::operator*(&local_80);
    pTVar5 = de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>::operator->(pSVar4);
    ThreadGroupThread::start(pTVar5,&this->m_barrier);
    __gnu_cxx::
    __normal_iterator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_*,_std::vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>_>
    ::operator++(&local_80);
  }
  local_90._M_current =
       (SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread> *)
       std::
       vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
       ::begin(&this->m_threads);
  while( true ) {
    threadResult = (ResultCollector *)
                   std::
                   vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                   ::end(&this->m_threads);
    bVar1 = __gnu_cxx::operator!=
                      (&local_90,
                       (__normal_iterator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_*,_std::vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>_>
                        *)&threadResult);
    if (!bVar1) break;
    pSVar4 = __gnu_cxx::
             __normal_iterator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_*,_std::vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>_>
             ::operator*(&local_90);
    pTVar5 = de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>::operator->(pSVar4);
    local_a0 = ThreadGroupThread::getResultCollector(pTVar5);
    pSVar4 = __gnu_cxx::
             __normal_iterator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_*,_std::vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>_>
             ::operator*(&local_90);
    pTVar5 = de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>::operator->(pSVar4);
    de::Thread::join(&pTVar5->super_Thread);
    qVar2 = tcu::ResultCollector::getResult(local_a0);
    tcu::ResultCollector::getMessage_abi_cxx11_(&local_c0,local_a0);
    tcu::ResultCollector::addResult((ResultCollector *)local_68,qVar2,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    __gnu_cxx::
    __normal_iterator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_*,_std::vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>_>
    ::operator++(&local_90);
  }
  qVar2 = tcu::ResultCollector::getResult((ResultCollector *)local_68);
  tcu::ResultCollector::getMessage_abi_cxx11_(&local_e0,(ResultCollector *)local_68);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,qVar2,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_68);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ThreadGroup::run (void)
{
	tcu::ResultCollector	resultCollector;

	m_barrier.reset((int)m_threads.size());

	for (ThreadVector::iterator threadIter = m_threads.begin(); threadIter != m_threads.end(); ++threadIter)
		(*threadIter)->start(&m_barrier);

	for (ThreadVector::iterator threadIter = m_threads.begin(); threadIter != m_threads.end(); ++threadIter)
	{
		tcu::ResultCollector&	threadResult	= (*threadIter)->getResultCollector();
		(*threadIter)->join();
		resultCollector.addResult(threadResult.getResult(), threadResult.getMessage());
	}

	return tcu::TestStatus(resultCollector.getResult(), resultCollector.getMessage());
}